

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_base64.hxx
# Opt level: O0

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 cryptox::
 to_base64<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::__cxx11::string>>
           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            first,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  last,
           back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           d_first)

{
  bool bVar1;
  int iVar2;
  uint8_t *puVar3;
  bool local_171;
  size_t output_size;
  uint8_t output [160];
  ulong local_b0;
  size_t input_size;
  uint8_t input [128];
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  d_first_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first_local;
  
  input._120_8_ = d_first.container;
  d_first_local.container =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)last._M_current;
  last_local._M_current = first._M_current;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&last_local,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&d_first_local);
    if (!bVar1) break;
    local_b0 = 0;
    while( true ) {
      local_171 = false;
      if (local_b0 < 0x80) {
        local_171 = __gnu_cxx::operator!=
                              (&last_local,
                               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&d_first_local);
      }
      if (local_171 == false) break;
      output._152_8_ =
           __gnu_cxx::
           __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator++(&last_local,0);
      puVar3 = (uint8_t *)
               __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)(output + 0x98));
      input[local_b0 - 8] = *puVar3;
      local_b0 = local_b0 + 1;
    }
    iVar2 = EVP_EncodeBlock((uchar *)&output_size,(uchar *)&input_size,(int)local_b0);
    input._120_8_ =
         std::copy<unsigned_char*,std::back_insert_iterator<std::__cxx11::string>>
                   ((uchar *)&output_size,output + (long)iVar2 + -8,
                    (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     )input._120_8_);
  }
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)input._120_8_;
}

Assistant:

Output to_base64(Input first, Input last, Output d_first) {
		while (first != last) {
			std::uint8_t input[128];
			size_t input_size = 0;
			while (input_size < sizeof(input) && first != last)
				input[input_size++] = *first++;

			std::uint8_t output[160];
			const size_t output_size = EVP_EncodeBlock(output,
			                                           input,
			                                           input_size);

			d_first = std::copy(output, output + output_size, d_first);
		}

		return d_first;
	}